

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char *__s1;
  int iVar3;
  lws_context *context;
  unsigned_long uVar4;
  ulong uVar5;
  uint secs;
  char *pcVar6;
  lws_protocols *plVar7;
  lws **pplVar8;
  uint *last;
  size_t sStack_1170;
  uint local_1164;
  uint local_1160;
  int local_1158;
  uint rl_dumb;
  lws_context *local_1150;
  uint rl_mirror;
  unsigned_long local_1140;
  char *prot;
  char *p;
  lws_client_connect_info local_1128;
  lws_context_creation_info local_1048;
  char path [300];
  char ca_path [1024];
  char key_path [1024];
  char cert_path [1024];
  
  rl_dumb = 0;
  rl_mirror = 0;
  memset(cert_path,0,0x400);
  memset(key_path,0,0x400);
  memset(ca_path,0,0x400);
  local_1140 = lws_now_secs();
  memset(&local_1048,0,0x2e0);
  _lws_log(4,"libwebsockets test client - license MIT\n");
  _lws_log(4,"(C) Copyright 2010-2018 Andy Green <andy@warmcat.com>\n");
  if (1 < argc) {
    local_1158 = -1;
    local_1150 = (lws_context *)CONCAT44(local_1150._4_4_,0x1e01);
    local_1164 = 0;
    local_1160 = 0;
    bVar1 = false;
switchD_0010c04e_caseD_51:
    iVar3 = getopt_long(argc,argv,"Sjnuv:hsp:d:lC:K:A:P:moeO",options,0);
    if (iVar3 < 0) {
      if (_optind < argc) {
        signal(2,sighandler);
        memset(&local_1128,0,0xe0);
        local_1128.port = (int)local_1150;
        iVar3 = lws_parse_uri(argv[_optind],&prot,&local_1128.address,&local_1128.port,&p);
        if (iVar3 == 0) {
          pcVar6 = p;
          if (*p != '/') {
            path[0] = '/';
            lws_strncpy(path + 1,p,299);
            pcVar6 = path;
          }
          __s1 = prot;
          local_1128.path = pcVar6;
          iVar3 = strcmp(prot,"http");
          if ((iVar3 == 0) || (((*__s1 == 'w' && (__s1[1] == 's')) && (__s1[2] == '\0')))) {
            local_1164 = 0;
          }
          iVar3 = strcmp(__s1,"https");
          if ((iVar3 == 0) || (iVar3 = strcmp(__s1,"wss"), iVar3 == 0)) {
            local_1164 = local_1164 + (local_1164 == 0);
          }
          _lws_log(0x10,"\'%s\' %p \'%s\' %p\n",local_1128.address,local_1128.address,pcVar6,pcVar6)
          ;
          local_1048.port = -1;
          local_1048.protocols = protocols;
          local_1048.gid = -1;
          local_1048.uid = -1;
          local_1048.ws_ping_pong_interval = (unsigned_short)local_1160;
          local_1048.extensions = exts;
          local_1048.fd_limit_per_thread = 6;
          local_1048.options._0_4_ = (uint)local_1048.options | 0x80001000;
          if (local_1164 == 0) {
LAB_0010c375:
            pcVar6 = " SSL disabled\n";
          }
          else {
            if (cert_path[0] != '\0') {
              local_1048.client_ssl_cert_filepath = cert_path;
            }
            if (key_path[0] != '\0') {
              local_1048.client_ssl_private_key_filepath = key_path;
            }
            if (ca_path[0] == '\0') {
              if (crl_path[0] != '\0') {
                _lws_log(4,"WARNING, providing a CRL requires a CA cert!\n");
              }
            }
            else {
              local_1048.client_ssl_ca_filepath = ca_path;
            }
            if ((local_1164 & 1) == 0) goto LAB_0010c375;
            pcVar6 = " Using SSL\n";
          }
          _lws_log(4,pcVar6);
          pcVar6 = " Selfsigned certs allowed\n";
          if ((local_1164 & 2) == 0) {
            pcVar6 = " Cert must validate correctly (use -s to allow selfsigned)\n";
          }
          _lws_log(4,pcVar6);
          pcVar6 = " Skipping peer cert hostname check\n";
          if ((local_1164 & 4) == 0) {
            pcVar6 = " Requiring peer cert hostname matches\n";
          }
          _lws_log(4,pcVar6);
          context = lws_create_context(&local_1048);
          if (context != (lws_context *)0x0) {
            local_1128.host = local_1128.address;
            local_1128.origin = local_1128.address;
            local_1128.ietf_version_or_minus_one = local_1158;
            local_1128.context = context;
            local_1128.ssl_connection = local_1164;
            iVar3 = strcmp(prot,"http");
            if ((iVar3 == 0) || (iVar3 = strcmp(prot,"https"), iVar3 == 0)) {
              pcVar6 = "using %s mode (non-ws)\n";
              _lws_log(4,"using %s mode (non-ws)\n",prot);
              if (test_post == '\x01') {
                local_1128.method = "POST";
                pcVar6 = "POST mode\n";
                goto LAB_0010c4e7;
              }
              local_1128.method = "GET";
            }
            else {
              iVar3 = strcmp(prot,"raw");
              if (iVar3 != 0) {
                pcVar6 = "using %s mode (ws)\n";
                bVar2 = false;
                _lws_log(4,"using %s mode (ws)\n",prot);
                goto LAB_0010c4f7;
              }
              local_1128.method = "RAW";
              local_1128.protocol = "lws-test-raw-client";
              pcVar6 = "using RAW mode connection\n";
LAB_0010c4e7:
              _lws_log(4,pcVar6);
            }
            bVar2 = true;
LAB_0010c4f7:
            local_1164 = 0;
            local_1150 = context;
            while (secs = (uint)pcVar6, force_exit == 0) {
              if (bVar1) {
                pplVar8 = wsi_multi;
                last = rl_multi;
                for (uVar5 = 0; uVar5 != 3; uVar5 = uVar5 + 1) {
                  if ((*pplVar8 == (lws *)0x0) &&
                     (iVar3 = ratelimit_connects(last,(uint)pcVar6), iVar3 != 0)) {
                    pcVar6 = "dumb %d: connecting\n";
                    _lws_log(4,"dumb %d: connecting\n",uVar5 & 0xffffffff);
                    local_1128.protocol = "dumb-increment-protocol";
                    local_1128.pwsi = pplVar8;
                    lws_client_connect_via_info(&local_1128);
                  }
                  last = last + 1;
                  pplVar8 = pplVar8 + 1;
                }
              }
              else if (bVar2) {
                if ((wsi_dumb == (lws *)0x0) &&
                   (iVar3 = ratelimit_connects(&rl_dumb,secs), iVar3 != 0)) {
                  _lws_log(4,"http: connecting\n");
                  local_1128.pwsi = &wsi_dumb;
                  lws_client_connect_via_info(&local_1128);
                }
              }
              else {
                if ((((flag_echo == '\0') && ((justmirror & 1) == 0)) && (wsi_dumb == (lws *)0x0))
                   && (iVar3 = ratelimit_connects(&rl_dumb,secs), iVar3 != 0)) {
                  secs = 0x137379;
                  _lws_log(4,"dumb: connecting\n");
                  local_1128.protocol = "dumb-increment-protocol";
                  local_1128.pwsi = &wsi_dumb;
                  lws_client_connect_via_info(&local_1128);
                }
                if ((wsi_mirror == (lws *)0x0) &&
                   (iVar3 = ratelimit_connects(&rl_mirror,secs), iVar3 != 0)) {
                  _lws_log(4,"mirror: connecting\n");
                  local_1128.protocol = "lws-mirror-protocol";
                  local_1128.pwsi = &wsi_mirror;
                  wsi_mirror = lws_client_connect_via_info(&local_1128);
                }
              }
              context = local_1150;
              pcVar6 = (char *)0x1f4;
              lws_service(local_1150,500);
              if ((bVar1) && (local_1164 = local_1164 + 1, local_1164 == 10)) {
                local_1164 = 0;
                _lws_log(4,"doing lws_callback_on_writable_all_protocol\n");
                plVar7 = protocols;
                lws_callback_on_writable_all_protocol(context,protocols);
                pcVar6 = (char *)plVar7;
              }
              if ((flag_echo == '\x01') && (uVar4 = lws_now_secs(), uVar4 != local_1140)) {
                pcVar6 = "rxb %d, rx_count %d\n";
                _lws_log(4,"rxb %d, rx_count %d\n",(ulong)rxb,(ulong)rx_count);
                local_1140 = lws_now_secs();
              }
            }
            _lws_log(1,"Exiting\n");
            lws_context_destroy(context);
            return 0;
          }
          pcVar6 = "Creating libwebsocket context failed\n";
          sStack_1170 = 0x25;
          goto LAB_0010c753;
        }
      }
      goto switchD_0010c04e_caseD_68;
    }
    switch(iVar3) {
    case 0x4f:
      once = 1;
      goto switchD_0010c04e_caseD_51;
    case 0x50:
      local_1160 = atoi(_optarg);
      _lws_log(4,"Setting pingpong interval to %d\n",(ulong)local_1160);
    case 0x51:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6b:
    case 0x71:
    case 0x72:
    case 0x74:
      goto switchD_0010c04e_caseD_51;
    case 0x52:
      lws_strncpy(crl_path,_optarg,0x400);
      goto switchD_0010c04e_caseD_51;
    case 0x53:
      local_1164 = 1;
      goto switchD_0010c04e_caseD_51;
    case 100:
      iVar3 = atoi(_optarg);
      lws_set_log_level(iVar3,(_func_void_int_char_ptr *)0x0);
      goto switchD_0010c04e_caseD_51;
    case 0x65:
      flag_echo = '\x01';
      goto switchD_0010c04e_caseD_51;
    case 0x68:
      break;
    case 0x6a:
      justmirror = 1;
      goto switchD_0010c04e_caseD_51;
    case 0x6c:
      longlived = 1;
      goto switchD_0010c04e_caseD_51;
    case 0x6d:
      bVar1 = true;
      goto switchD_0010c04e_caseD_51;
    case 0x6e:
      flag_no_mirror_traffic = 1;
      _lws_log(4,"Disabled sending mirror data (for pingpong testing)\n");
      goto switchD_0010c04e_caseD_51;
    case 0x6f:
      test_post = '\x01';
      goto switchD_0010c04e_caseD_51;
    case 0x70:
      iVar3 = atoi(_optarg);
      local_1150 = (lws_context *)CONCAT44(local_1150._4_4_,iVar3);
      goto switchD_0010c04e_caseD_51;
    case 0x73:
      local_1164 = 7;
      goto switchD_0010c04e_caseD_51;
    case 0x75:
      deny_deflate = 1;
      goto switchD_0010c04e_caseD_51;
    case 0x76:
      local_1158 = atoi(_optarg);
      goto switchD_0010c04e_caseD_51;
    default:
      if (iVar3 == 0x41) {
        lws_strncpy(ca_path,_optarg,0x400);
      }
      else if (iVar3 == 0x43) {
        lws_strncpy(cert_path,_optarg,0x400);
      }
      else if (iVar3 == 0x4b) {
        lws_strncpy(key_path,_optarg,0x400);
      }
      goto switchD_0010c04e_caseD_51;
    }
  }
switchD_0010c04e_caseD_68:
  pcVar6 = 
  "Usage: libwebsockets-test-client <server address> [--port=<p>] [--ssl] [-k] [-v <ver>] [-d <log bitfield>] [-l]\n"
  ;
  sStack_1170 = 0x70;
LAB_0010c753:
  fwrite(pcVar6,sStack_1170,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
	int n = 0, m, ret = 0, port = 7681, use_ssl = 0, ietf_version = -1;
	unsigned int rl_dumb = 0, rl_mirror = 0, do_ws = 1, pp_secs = 0,
		     do_multi = 0;
	struct lws_context_creation_info info;
	struct lws_client_connect_info i;
	struct lws_context *context;
	const char *prot, *p;
	char path[300];
	char cert_path[1024] = "";
	char key_path[1024] = "";
	char ca_path[1024] = "";
	unsigned long last = lws_now_secs();

	memset(&info, 0, sizeof info);

	lwsl_notice("libwebsockets test client - license MIT\n");
	lwsl_notice("(C) Copyright 2010-2018 Andy Green <andy@warmcat.com>\n");

	if (argc < 2)
		goto usage;

	while (n >= 0) {
#if defined(LWS_HAS_GETOPT_LONG) || defined(WIN32)
       n = getopt_long(argc, argv, "Sjnuv:hsp:d:lC:K:A:P:moeO", options, NULL);
#else
       n = getopt(argc, argv, "Sjnuv:hsp:d:lC:K:A:P:moeO");
#endif
		if (n < 0)
			continue;
		switch (n) {
		case 'd':
			lws_set_log_level(atoi(optarg), NULL);
			break;
		case 's': /* lax SSL, allow selfsigned, skip checking hostname */
			use_ssl = LCCSCF_USE_SSL |
				  LCCSCF_ALLOW_SELFSIGNED |
				  LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK;
			break;
		case 'S': /* Strict SSL, no selfsigned, check server hostname */
			use_ssl = LCCSCF_USE_SSL;
			break;
		case 'p':
			port = atoi(optarg);
			break;
		case 'e':
			flag_echo = 1;
			break;
		case 'P':
			pp_secs = atoi(optarg);
			lwsl_notice("Setting pingpong interval to %d\n", pp_secs);
			break;
		case 'j':
			justmirror = 1;
			break;
		case 'l':
			longlived = 1;
			break;
		case 'v':
			ietf_version = atoi(optarg);
			break;
		case 'u':
			deny_deflate = 1;
			break;
		case 'm':
			do_multi = 1;
			break;
		case 'o':
			test_post = 1;
			break;
		case 'O':
			once = 1;
			break;
		case 'n':
			flag_no_mirror_traffic = 1;
			lwsl_notice("Disabled sending mirror data (for pingpong testing)\n");
			break;
		case 'C':
			lws_strncpy(cert_path, optarg, sizeof(cert_path));
			break;
		case 'K':
			lws_strncpy(key_path, optarg, sizeof(key_path));
			break;
		case 'A':
			lws_strncpy(ca_path, optarg, sizeof(ca_path));
			break;

#if defined(LWS_WITH_TLS) && defined(LWS_HAVE_SSL_CTX_set1_param)
		case 'R':
			lws_strncpy(crl_path, optarg, sizeof(crl_path));
			break;
#endif
		case 'h':
			goto usage;
		}
	}

	if (optind >= argc)
		goto usage;

	signal(SIGINT, sighandler);

	memset(&i, 0, sizeof(i));

	i.port = port;
	if (lws_parse_uri(argv[optind], &prot, &i.address, &i.port, &p))
		goto usage;

	/* add back the leading / on path */
	if (p[0] != '/') {
		path[0] = '/';
		lws_strncpy(path + 1, p, sizeof(path) - 1);
		i.path = path;
	} else
		i.path = p;

	if (!strcmp(prot, "http") || !strcmp(prot, "ws"))
		use_ssl = 0;
	if (!strcmp(prot, "https") || !strcmp(prot, "wss"))
		if (!use_ssl)
			use_ssl = LCCSCF_USE_SSL;

	lwsl_debug("'%s' %p '%s' %p\n", i.address, i.address, i.path, i.path);

	/*
	 * create the websockets context.  This tracks open connections and
	 * knows how to route any traffic and which protocol version to use,
	 * and if each connection is client or server side.
	 *
	 * For this client-only demo, we tell it to not listen on any port.
	 */

	info.port = CONTEXT_PORT_NO_LISTEN;
	info.protocols = protocols;
	info.gid = -1;
	info.uid = -1;
	info.ws_ping_pong_interval = pp_secs;
	info.extensions = exts;

	/*
	 * since we know this lws context is only ever going to be used with
	 * a few client wsis / fds / sockets at a time, let lws know it doesn't
	 * have to use the default allocations for fd tables up to ulimit -n.
	 * It will just allocate for 2 internal and 4 that we might use.
	 */
	info.fd_limit_per_thread = 2 + 4;

#if defined(LWS_WITH_TLS)
	info.options |= LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT;
#endif

	info.options |= LWS_SERVER_OPTION_H2_JUST_FIX_WINDOW_UPDATE_OVERFLOW;

	if (use_ssl) {
		/*
		 * If the server wants us to present a valid SSL client certificate
		 * then we can set it up here.
		 */

		if (cert_path[0])
			info.client_ssl_cert_filepath = cert_path;
		if (key_path[0])
			info.client_ssl_private_key_filepath = key_path;

		/*
		 * A CA cert and CRL can be used to validate the cert send by the server
		 */
		if (ca_path[0])
			info.client_ssl_ca_filepath = ca_path;

#if defined(LWS_WITH_TLS) && defined(LWS_HAVE_SSL_CTX_set1_param)
		else if (crl_path[0])
			lwsl_notice("WARNING, providing a CRL requires a CA cert!\n");
#endif
	}

	if (use_ssl & LCCSCF_USE_SSL) {
		lwsl_notice(" Using SSL\n");
#if defined(LWS_WITH_MBEDTLS)
		lwsl_notice("   (NOTE: mbedtls needs to be given the remote\n");
		lwsl_notice("    CA cert to trust (with -A) to validate it)\n");
#endif
	}
	else
		lwsl_notice(" SSL disabled\n");
	if (use_ssl & LCCSCF_ALLOW_SELFSIGNED)
		lwsl_notice(" Selfsigned certs allowed\n");
	else
		lwsl_notice(" Cert must validate correctly (use -s to allow selfsigned)\n");
	if (use_ssl & LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK)
		lwsl_notice(" Skipping peer cert hostname check\n");
	else
		lwsl_notice(" Requiring peer cert hostname matches\n");

	context = lws_create_context(&info);
	if (context == NULL) {
		fprintf(stderr, "Creating libwebsocket context failed\n");
		return 1;
	}

	i.context = context;
	i.ssl_connection = use_ssl;
	i.host = i.address;
	i.origin = i.address;
	i.ietf_version_or_minus_one = ietf_version;

	if (!strcmp(prot, "http") || !strcmp(prot, "https")) {
		lwsl_notice("using %s mode (non-ws)\n", prot);
		if (test_post) {
			i.method = "POST";
			lwsl_notice("POST mode\n");
		}
		else
			i.method = "GET";
		do_ws = 0;
	} else
		if (!strcmp(prot, "raw")) {
			i.method = "RAW";
			i.protocol = "lws-test-raw-client";
			lwsl_notice("using RAW mode connection\n");
			do_ws = 0;
		} else
			lwsl_notice("using %s mode (ws)\n", prot);

	/*
	 * sit there servicing the websocket context to handle incoming
	 * packets, and drawing random circles on the mirror protocol websocket
	 *
	 * nothing happens until the client websocket connection is
	 * asynchronously established... calling lws_client_connect() only
	 * instantiates the connection logically, lws_service() progresses it
	 * asynchronously.
	 */

	m = 0;
	while (!force_exit) {

		if (do_multi) {
			for (n = 0; n < (int)LWS_ARRAY_SIZE(wsi_multi); n++) {
				if (!wsi_multi[n] && ratelimit_connects(&rl_multi[n], 2u)) {
					lwsl_notice("dumb %d: connecting\n", n);
					i.protocol = protocols[PROTOCOL_DUMB_INCREMENT].name;
					i.pwsi = &wsi_multi[n];
					lws_client_connect_via_info(&i);
				}
			}
		} else {

			if (do_ws) {
				if (!flag_echo && !justmirror && !wsi_dumb && ratelimit_connects(&rl_dumb, 2u)) {
					lwsl_notice("dumb: connecting\n");
					i.protocol = protocols[PROTOCOL_DUMB_INCREMENT].name;
					i.pwsi = &wsi_dumb;
					lws_client_connect_via_info(&i);
				}

				if (!wsi_mirror && ratelimit_connects(&rl_mirror, 2u)) {
					lwsl_notice("mirror: connecting\n");
					i.protocol = protocols[PROTOCOL_LWS_MIRROR].name;
					i.pwsi = &wsi_mirror;
					wsi_mirror = lws_client_connect_via_info(&i);
				}
			} else
				if (!wsi_dumb && ratelimit_connects(&rl_dumb, 2u)) {
					lwsl_notice("http: connecting\n");
					i.pwsi = &wsi_dumb;
					lws_client_connect_via_info(&i);
				}
		}

		lws_service(context, 500);

		if (do_multi) {
			m++;
			if (m == 10) {
				m = 0;
				lwsl_notice("doing lws_callback_on_writable_all_protocol\n");
				lws_callback_on_writable_all_protocol(context,
					   &protocols[PROTOCOL_DUMB_INCREMENT]);
			}
		}

		if (flag_echo && lws_now_secs() != last) {
			lwsl_notice("rxb %d, rx_count %d\n", rxb, rx_count);
			last = lws_now_secs();
		}
	}

	lwsl_err("Exiting\n");
	lws_context_destroy(context);

	return ret;

usage:
	fprintf(stderr, "Usage: libwebsockets-test-client "
				"<server address> [--port=<p>] "
				"[--ssl] [-k] [-v <ver>] "
				"[-d <log bitfield>] [-l]\n");
	return 1;
}